

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  Curl_llist *pCVar1;
  long lVar2;
  int iVar3;
  Curl_llist_element *pCVar4;
  
  pCVar1 = iter->hash->table;
  if (pCVar1 == (Curl_llist *)0x0) {
    return (Curl_hash_element *)0x0;
  }
  if (iter->current_element != (Curl_llist_element *)0x0) {
    pCVar4 = iter->current_element->next;
    iter->current_element = pCVar4;
    if (pCVar4 != (Curl_llist_element *)0x0) goto LAB_004dec67;
  }
  iVar3 = iter->slot_index;
  lVar2 = (long)iVar3;
  pCVar1 = pCVar1 + lVar2;
  while( true ) {
    iVar3 = iVar3 + 1;
    if (iter->hash->slots <= lVar2) {
      return (Curl_hash_element *)0x0;
    }
    pCVar4 = pCVar1->head;
    if (pCVar4 != (Curl_llist_element *)0x0) break;
    lVar2 = lVar2 + 1;
    pCVar1 = pCVar1 + 1;
  }
  iter->current_element = pCVar4;
  iter->slot_index = iVar3;
LAB_004dec67:
  return (Curl_hash_element *)pCVar4->ptr;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h = iter->hash;

  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = iter->current_element->next;

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    int i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(h->table[i].head) {
        iter->current_element = h->table[i].head;
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = iter->current_element->ptr;
    return he;
  }
  return NULL;
}